

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,char_const*&>(pybind11 *this,char **args_)

{
  array<pybind11::object,_1UL> aVar1;
  cast_error *this_00;
  allocator local_81;
  array<pybind11::object,_1UL> args;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  args._M_elems[0].super_handle.m_ptr =
       (_Type)detail::type_caster<char,_void>::cast(*args_,automatic_reference,(handle)0x0);
  if (args._M_elems[0].super_handle.m_ptr == (object)0x0) {
    this_00 = (cast_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_78,"St5tupleIJRPKcEE",&local_81);
    detail::clean_type_id(&local_78);
    std::operator+(&local_58,"make_tuple(): unable to convert arguments of types \'",&local_78);
    std::operator+(&local_38,&local_58,"\' to Python object");
    cast_error::runtime_error(this_00,&local_38);
    __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tuple::tuple((tuple *)this,1);
  aVar1._M_elems[0].super_handle.m_ptr = args._M_elems[0].super_handle.m_ptr;
  args._M_elems[0].super_handle.m_ptr = (_Type)(object)0x0;
  if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) != 0) {
    (*(_Type *)(*(long *)this + 0x18))[0] = (object)aVar1._M_elems[0].super_handle.m_ptr;
    object::~object(args._M_elems);
    return (object)(object)this;
  }
  __assert_fail("PyTuple_Check(result.ptr())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/benikabocha[P]py_embedded_sample/external/pybind11/include/pybind11/cast.h"
                ,0x496,
                "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const char *&>]"
               );
}

Assistant:

tuple make_tuple(Args&&... args_) {
    const size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (auto &arg_value : args) {
        if (!arg_value) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            throw cast_error("make_tuple(): unable to convert arguments of types '" +
                (std::string) type_id<std::tuple<Args...>>() + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}